

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O0

exr_result_t
exr_attr_opaquedata_copy(exr_context_t ctxt,exr_attr_opaquedata_t *ud,exr_attr_opaquedata_t *srcud)

{
  exr_attr_opaquedata_t *in_RDX;
  exr_context_t in_RSI;
  exr_context_t in_RDI;
  exr_result_t rv;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  exr_result_t local_4;
  
  if (in_RDX == (exr_attr_opaquedata_t *)0x0) {
    local_4 = 3;
  }
  else if (in_RDX->packed_data == (void *)0x0) {
    local_4 = exr_attr_opaquedata_init(ctxt,ud,(size_t)srcud);
    if (local_4 == 0) {
      local_4 = exr_attr_opaquedata_set_unpacked
                          (in_RSI,in_RDX,(void *)(ulong)in_stack_ffffffffffffffd8,0);
    }
  }
  else {
    local_4 = exr_attr_opaquedata_create
                        (in_RDI,(exr_attr_opaquedata_t *)in_RSI,(size_t)in_RDX,
                         (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_opaquedata_copy (
    exr_context_t                ctxt,
    exr_attr_opaquedata_t*       ud,
    const exr_attr_opaquedata_t* srcud)
{
    exr_result_t rv;
    if (!srcud) return EXR_ERR_INVALID_ARGUMENT;
    if (srcud->packed_data)
        return exr_attr_opaquedata_create (
            ctxt, ud, (size_t) srcud->size, srcud->packed_data);
    rv = exr_attr_opaquedata_init (ctxt, ud, 0);
    if (rv == EXR_ERR_SUCCESS)
        rv = exr_attr_opaquedata_set_unpacked (
            ctxt, ud, srcud->unpacked_data, srcud->unpacked_size);
    return rv;
}